

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdasher.cpp
# Opt level: O3

void __thiscall VDasher::lineTo(VDasher *this,VPointF *p)

{
  ulong uVar1;
  Dash *pDVar2;
  VPointF *p_00;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar10;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  VPointF local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  float local_38;
  float fStack_34;
  uint uStack_30;
  uint uStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  fVar12 = (this->mCurPt).mx;
  fVar13 = (this->mCurPt).my;
  fVar14 = (*p).mx;
  auVar8._0_4_ = fVar14 - fVar12;
  fVar15 = (*p).my;
  auVar8._4_4_ = fVar15 - fVar13;
  auVar8._8_8_ = 0;
  uVar1 = CONCAT44(auVar8._4_4_,auVar8._0_4_);
  auVar7._0_8_ = uVar1 ^ 0x8000000080000000;
  auVar7._8_4_ = 0x80000000;
  auVar7._12_4_ = 0x80000000;
  auVar8 = maxps(auVar7,auVar8);
  fVar6 = auVar8._0_4_;
  fVar10 = auVar8._4_4_;
  fVar11 = (float)(-(uint)(fVar10 < fVar6) & (uint)(fVar10 * 0.375 + fVar6) |
                  ~-(uint)(fVar10 < fVar6) & (uint)(fVar6 * 0.375 + fVar10));
  fVar6 = this->mCurrentLength;
  if (fVar11 <= fVar6) {
    this->mCurrentLength = fVar6 - fVar11;
    p_00 = p;
  }
  else {
    if (fVar6 < fVar11) {
      local_58 = fVar12;
      fStack_54 = fVar13;
      fStack_20 = fVar14;
      fStack_1c = fVar15;
      fStack_34 = fVar10;
      uStack_30 = (uint)fVar10 | ~(uint)fVar10 & auVar8._8_4_;
      uStack_2c = (uint)fVar10 | ~(uint)fVar10 & auVar8._12_4_;
      do {
        auVar4._0_4_ = fStack_20 - local_58;
        auVar4._4_4_ = fStack_1c - fStack_54;
        auVar4._8_4_ = fStack_20 - fStack_20;
        auVar4._12_4_ = fStack_1c - fStack_1c;
        uVar1 = CONCAT44(auVar4._4_4_,auVar4._0_4_);
        auVar5._0_8_ = uVar1 ^ 0x8000000080000000;
        auVar5._8_4_ = -auVar4._8_4_;
        auVar5._12_4_ = -auVar4._12_4_;
        auVar8 = maxps(auVar5,auVar4);
        fVar14 = auVar8._0_4_;
        fVar15 = auVar8._4_4_;
        auVar9._0_4_ = -(uint)(fVar15 < fVar14) & (uint)(fVar15 * 0.375 + fVar14) |
                       ~-(uint)(fVar15 < fVar14) & (uint)(fVar14 * 0.375 + fVar15);
        auVar9._4_4_ = auVar9._0_4_;
        auVar9._8_4_ = auVar9._0_4_;
        auVar9._12_4_ = auVar9._0_4_;
        auVar8 = divps(auVar4,auVar9);
        local_48 = ZEXT416((uint)fVar6);
        fVar14 = fVar6 * auVar8._0_4_ + local_58;
        fVar15 = fVar6 * auVar8._4_4_ + fStack_54;
        fStack_50 = fVar6 * auVar8._8_4_ + fStack_20;
        fStack_4c = fVar6 * auVar8._12_4_ + fStack_1c;
        local_60.my = fVar15;
        local_60.mx = fVar14;
        local_28 = local_58;
        local_58 = fVar14;
        fStack_24 = fStack_54;
        fStack_54 = fVar15;
        local_38 = fVar11;
        addLine(this,&local_60);
        bVar3 = this->mDiscard;
        uVar1 = this->mIndex;
        do {
          bVar3 = (bVar3 & 1) == 0;
          if ((bool)bVar3) {
            pDVar2 = (Dash *)&this->mDashArray[uVar1].gap;
          }
          else {
            uVar1 = (uVar1 + 1) % this->mArraySize;
            this->mIndex = uVar1;
            pDVar2 = this->mDashArray + uVar1;
          }
          fVar6 = pDVar2->length;
          this->mCurrentLength = fVar6;
        } while (ABS(fVar6) <= 1e-06);
        this->mDiscard = (bool)bVar3;
        fVar11 = local_38 - (float)local_48._0_4_;
        this->mStartNewSegment = true;
        (this->mCurPt).mx = local_58;
        (this->mCurPt).my = fStack_54;
        fVar14 = fStack_20;
        fVar15 = fStack_1c;
      } while (fVar6 < fVar11);
    }
    if (fVar11 <= 0.1) goto LAB_0010cd02;
    this->mCurrentLength = fVar6 - fVar11;
    local_60.my = fVar15;
    local_60.mx = fVar14;
    p_00 = &local_60;
  }
  addLine(this,p_00);
  fVar6 = this->mCurrentLength;
LAB_0010cd02:
  if (fVar6 < 0.1) {
    bVar3 = this->mDiscard;
    uVar1 = this->mIndex;
    do {
      bVar3 = (bVar3 & 1) == 0;
      if ((bool)bVar3) {
        pDVar2 = (Dash *)&this->mDashArray[uVar1].gap;
      }
      else {
        uVar1 = (uVar1 + 1) % this->mArraySize;
        this->mIndex = uVar1;
        pDVar2 = this->mDashArray + uVar1;
      }
      fVar6 = pDVar2->length;
      this->mCurrentLength = fVar6;
    } while (ABS(fVar6) <= 1e-06);
    this->mDiscard = (bool)bVar3;
    this->mStartNewSegment = true;
  }
  this->mCurPt = *p;
  return;
}

Assistant:

void VDasher::lineTo(const VPointF &p)
{
    VLine left, right;
    VLine line(mCurPt, p);
    float length = line.length();

    if (length <= mCurrentLength) {
        mCurrentLength -= length;
        addLine(p);
    } else {
        while (length > mCurrentLength) {
            length -= mCurrentLength;
            line.splitAtLength(mCurrentLength, left, right);

            addLine(left.p2());
            updateActiveSegment();

            line = right;
            mCurPt = line.p1();
        }
        // handle remainder
        if (length > tolerance) {
            mCurrentLength -= length;
            addLine(line.p2());
        }
    }

    if (mCurrentLength < tolerance) updateActiveSegment();

    mCurPt = p;
}